

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O2

void __thiscall
google::protobuf::UnknownFieldSet::AddVarint(UnknownFieldSet *this,int number,uint64 value)

{
  undefined1 local_18 [8];
  UnknownField field;
  
  local_18._4_4_ = 0;
  local_18._0_4_ = number;
  field._0_8_ = value;
  std::vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>::
  push_back(&this->fields_,(value_type *)local_18);
  return;
}

Assistant:

void UnknownFieldSet::AddVarint(int number, uint64 value) {
  UnknownField field;
  field.number_ = number;
  field.SetType(UnknownField::TYPE_VARINT);
  field.data_.varint_ = value;
  fields_.push_back(field);
}